

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

BBLIter __thiscall mocker::ir::FunctionModule::insertBBAfter(FunctionModule *this,BBLIter iter)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  if ((_List_node_base *)&this->bbs != iter._M_node) {
    p_Var2 = (_List_node_base *)this->bbsSz;
    this->bbsSz = (size_t)((long)&p_Var2->_M_next + 1);
    p_Var3 = (_List_node_base *)operator_new(0x30);
    p_Var3[1]._M_next = p_Var2;
    p_Var3[2]._M_next = (_List_node_base *)&p_Var3[1]._M_prev;
    p_Var3[1]._M_prev = (_List_node_base *)&p_Var3[1]._M_prev;
    p_Var3[2]._M_prev = (_List_node_base *)0x0;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->bbs).
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return (BBLIter)p_Var3;
  }
  __assert_fail("iter != bbs.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/module.cpp"
                ,0x40,"BBLIter mocker::ir::FunctionModule::insertBBAfter(BBLIter)");
}

Assistant:

BBLIter FunctionModule::insertBBAfter(BBLIter iter) {
  assert(iter != bbs.end());
  ++iter;
  return bbs.emplace(iter, bbsSz++);
}